

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O1

void BruteForceTexture(int x,int y,int samps)

{
  iterator iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  clock_t cVar5;
  uint uVar6;
  pair<Vector,_Vector> *elem;
  long lVar7;
  pair<Vector,_Vector> *ppVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 extraout_XMM0_Qb;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> _filter_elems;
  PosFilter filter;
  int local_144;
  pair<Vector,_Vector> *local_118;
  iterator iStack_110;
  pair<Vector,_Vector> *local_108;
  float local_fc;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [32];
  double local_c8;
  double dStack_c0;
  Random local_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [40];
  double local_40;
  
  local_f8 = 0.0;
  dStack_f0 = 0.0;
  local_118 = (pair<Vector,_Vector> *)0x0;
  iStack_110._M_current = (pair<Vector,_Vector> *)0x0;
  local_108 = (pair<Vector,_Vector> *)0x0;
  iVar2 = std::thread::hardware_concurrency();
  if (0 < iVar2) {
    local_98 = (double)CONCAT44((float)y,(float)x);
    uStack_90 = 0;
    iVar11 = 0;
    dStack_f0 = 1.0;
    do {
      cVar5 = clock();
      uVar3 = (int)cVar5 * iVar2 + iVar11;
      uVar6 = uVar3 / 0x7fffffff << 0x1f | uVar3 / 0x7fffffff;
      local_b0._gen._M_x = (unsigned_long)(uVar6 + uVar3 + (uint)(uVar3 + uVar6 == 0));
      local_b0._dist._M_param._M_a = local_f8;
      local_b0._dist._M_param._M_b = dStack_f0;
      uVar9 = (long)samps / (long)iVar2 & 0xffffffff;
      if (0 < (int)((long)samps / (long)iVar2)) {
        do {
          dVar12 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (&local_b0._gen);
          dVar14 = local_b0._dist._M_param._M_a;
          local_88._8_8_ = 0;
          local_88._0_8_ = local_b0._dist._M_param._M_b;
          dVar13 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (&local_b0._gen);
          auVar15._0_4_ =
               (float)(dVar12 * ((double)local_88._0_8_ - dVar14) + dVar14) + (float)local_98;
          auVar15._4_4_ =
               (float)(dVar13 * (local_b0._dist._M_param._M_b - local_b0._dist._M_param._M_a) +
                      local_b0._dist._M_param._M_a) + local_98._4_4_;
          auVar15._8_4_ = (float)uStack_90 + 0.0;
          auVar15._12_4_ = uStack_90._4_4_ + 0.0;
          auVar20._0_4_ = (float)width;
          auVar20._4_4_ = (float)height;
          auVar20._8_8_ = 0;
          auVar15 = divps(auVar15,auVar20);
          dVar14 = (double)auVar15._0_4_ + -0.5;
          dVar12 = (double)auVar15._4_4_ + -0.5;
          dVar13 = cy.z * dVar12 + cx.z * dVar14 + cam.d.z;
          auVar24._0_8_ = cam.d.x + dVar12 * cy.x + dVar14 * cx.x;
          auVar24._8_8_ = cam.d.y + dVar12 * cy.y + dVar14 * cx.y;
          dVar14 = dVar13 * dVar13 + auVar24._0_8_ * auVar24._0_8_ + auVar24._8_8_ * auVar24._8_8_;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          local_40 = dVar13 / dVar14;
          auVar16._8_8_ = dVar14;
          auVar16._0_8_ = dVar14;
          local_68._24_16_ = divpd(auVar24,auVar16);
          local_68._16_8_ = cam.o.z;
          local_68._0_8_ = cam.o.x;
          local_68._8_8_ = cam.o.y;
          indirect_filter((PosFilter *)local_e8,(Ray *)local_68,&local_b0,0,1);
          if (iStack_110._M_current == local_108) {
            std::vector<std::pair<Vector,Vector>,std::allocator<std::pair<Vector,Vector>>>::
            _M_realloc_insert<std::pair<Vector,Vector>const&>
                      ((vector<std::pair<Vector,Vector>,std::allocator<std::pair<Vector,Vector>>> *)
                       &local_118,iStack_110,(PosFilter *)local_e8);
          }
          else {
            ((iStack_110._M_current)->second).y = local_c8;
            ((iStack_110._M_current)->second).z = dStack_c0;
            ((iStack_110._M_current)->first).z = (double)local_e8._16_8_;
            ((iStack_110._M_current)->second).x = (double)local_e8._24_8_;
            ((iStack_110._M_current)->first).x = (double)local_e8._0_8_;
            ((iStack_110._M_current)->first).y = (double)local_e8._8_8_;
            iStack_110._M_current = iStack_110._M_current + 1;
          }
          uVar3 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar3;
        } while (uVar3 != 0);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  if (height < 1) {
    fVar23 = 0.0;
  }
  else {
    fVar23 = 0.0;
    local_144 = 0;
    do {
      fVar19 = 0.0;
      local_fc = fVar23;
      if (0 < width) {
        local_78 = (double)local_144 + 0.5;
        uStack_70 = 0;
        uVar3 = 0;
        do {
          iVar11 = height;
          iVar2 = width;
          auVar17._0_8_ = (double)(int)uVar3 + 0.5;
          auVar17._8_8_ = local_78;
          auVar21._0_8_ = (double)width;
          auVar21._8_8_ = (double)height;
          auVar15 = divpd(auVar17,auVar21);
          dVar14 = auVar15._0_8_ + -0.5;
          dVar12 = auVar15._8_8_ + -0.5;
          dVar13 = cy.z * dVar12 + cx.z * dVar14 + cam.d.z;
          auVar25._0_8_ = cam.d.x + dVar12 * cy.x + dVar14 * cx.x;
          auVar25._8_8_ = cam.d.y + dVar12 * cy.y + dVar14 * cx.y;
          dVar14 = dVar13 * dVar13 + auVar25._0_8_ * auVar25._0_8_ + auVar25._8_8_ * auVar25._8_8_;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          dStack_c0 = dVar13 / dVar14;
          auVar18._8_8_ = dVar14;
          auVar18._0_8_ = dVar14;
          register0x000012c0 = divpd(auVar25,auVar18);
          local_e8._16_8_ = cam.o.z;
          local_e8._0_8_ = cam.o.x;
          local_e8._8_8_ = cam.o.y;
          iVar4 = (int)((long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_start >> 4) * -0x49249249;
          auVar15 = ZEXT816(0x4415af1d78b58c40);
          if (iVar4 != 0) {
            lVar7 = (long)iVar4;
            auVar15 = ZEXT816(0x4415af1d78b58c40);
            lVar10 = lVar7 * 0x70;
            do {
              dVar14 = Sphere::Intersect((Sphere *)
                                         ((long)&spheres.
                                                 super__Vector_base<Sphere,_std::allocator<Sphere>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].c.x +
                                         lVar10),(Ray *)local_e8);
              auVar26._8_8_ = extraout_XMM0_Qb;
              auVar26._0_8_ = dVar14;
              if (auVar15._0_8_ <= dVar14 || dVar14 == 0.0) {
                auVar26 = auVar15;
              }
              auVar15 = auVar26;
              lVar7 = lVar7 + -1;
              lVar10 = lVar10 + -0x70;
            } while (lVar7 != 0);
          }
          iVar1._M_current = iStack_110._M_current;
          dVar14 = auVar15._0_8_;
          if (dVar14 < 1e+20) {
            if (local_118 == iStack_110._M_current) {
              fVar23 = 0.0;
            }
            else {
              local_88._8_8_ = auVar15._8_8_;
              local_98 = (double)local_e8._24_8_ * dVar14 + (double)local_e8._0_8_;
              local_f8 = local_c8 * dVar14 + (double)local_e8._8_8_;
              local_88._0_8_ = dVar14 * dStack_c0 + (double)local_e8._16_8_;
              fVar23 = 0.0;
              ppVar8 = local_118;
              do {
                dVar14 = local_98 - (ppVar8->first).x;
                dVar12 = local_f8 - (ppVar8->first).y;
                dVar13 = local_88._0_8_ - (ppVar8->first).z;
                dVar14 = dVar13 * dVar13 + dVar14 * dVar14 + dVar12 * dVar12;
                if (dVar14 < 0.0) {
                  dVar14 = sqrt(dVar14);
                }
                else {
                  dVar14 = SQRT(dVar14);
                }
                fVar22 = 0.3989423 / filterRadius;
                dVar14 = exp((dVar14 / (double)filterRadius) * (dVar14 / (double)filterRadius) *
                             -0.5);
                fVar23 = (float)(dVar14 * (double)fVar22 * (ppVar8->second).x + (double)fVar23);
                ppVar8 = ppVar8 + 1;
              } while (ppVar8 != iVar1._M_current);
              fVar23 = fVar23 * 20.0;
            }
            iVar2 = iVar11 * (iVar2 + ~uVar3) + local_144;
            fVar23 = ((float)(nPassesFilter * samps) * ref_img[iVar2] + fVar23) /
                     (float)((nPassesFilter + 1) * samps);
            ref_img[iVar2] = fVar23;
            if (fVar19 <= fVar23) {
              fVar19 = fVar23;
            }
          }
          uVar3 = uVar3 + 1;
        } while ((int)uVar3 < width);
      }
      fVar23 = fVar19;
      if (fVar19 <= local_fc) {
        fVar23 = local_fc;
      }
      local_144 = local_144 + 1;
    } while (local_144 < height);
  }
  ref_scale = 1.0 / fVar23;
  dVar14 = ((double)nPassesFilter + 0.8) / ((double)nPassesFilter + 1.0);
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  filterRadius = (float)((double)filterRadius * dVar14);
  nPassesFilter = nPassesFilter + 1;
  if (local_118 != (pair<Vector,_Vector> *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  return;
}

Assistant:

void BruteForceTexture(int x, int y, int samps = 1000) {

   std::vector<PosFilter> _filter_elems;

   // Sub pixel sampling
   const int nthread = std::thread::hardware_concurrency();
   #pragma omp parallel for schedule(dynamic, 1)
   for(int t=0; t<nthread; ++t) {
      Random rng(t + nthread*clock());

      for(int s=0; s<samps/nthread; s++){

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/width  - .5) +
                    cy*((dy + y)/height - .5) + cam.d;
         d.Normalize();

         // Evaluate the Covariance and Radiance at the pixel location
         const auto filter = indirect_filter(Ray(cam.o, d), rng, 0, 1);
         #pragma omp critical
         {
            _filter_elems.push_back(filter);
         }
      }
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   float max_ref = 0.0f;
   #pragma omp parallel for schedule(dynamic, 1), shared(max_ref)
   for (int y=0; y<height; y++){
      float max_temp = 0.0f;

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;
         float _r = 0.0f;

         // Generate the pixel direction
         Vector d = cx*((0.5 + x)/width  - .5) +
                    cy*((0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         for(auto& elem : _filter_elems) {
            const auto& p = elem.first;
            const auto  x = Vector::Norm(hitp-p) / filterRadius;
            _r += (0.3989422804f/filterRadius) * exp(-0.5f * pow(x, 2)) * elem.second.x;
         }

         const auto scale = 20.f;
         const auto Nold  = nPassesFilter * samps;
         const auto Nnew  = (nPassesFilter+1) * samps;
         ref_img[i] = (ref_img[i]*Nold + scale*_r) / float(Nnew);
         max_temp   = std::max(ref_img[i], max_temp);
      }

      #pragma omp critical
      {
         max_ref = std::max(max_ref, max_temp);
      }
   }

   // Update the scaling
   ref_scale = 1.0f/max_ref;

   // Progressive refinement of the radius and number of passes
   filterRadius *= sqrt((nPassesFilter + 0.8) / (nPassesFilter + 1.0));
   ++nPassesFilter;
}